

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void QMutableTouchEvent::addPoint(QTouchEvent *e,QEventPoint *point)

{
  State other;
  QList<QEventPoint> *p;
  QPointingDevice *pQVar1;
  QPointerEvent *in_RDI;
  QEventPoint *added;
  QList<QEventPoint> *in_stack_ffffffffffffffd8;
  QList<QEventPoint> *in_stack_ffffffffffffffe0;
  
  QList<QEventPoint>::append(in_stack_ffffffffffffffe0,(parameter_type)in_stack_ffffffffffffffd8);
  p = (QList<QEventPoint> *)QList<QEventPoint>::last(in_stack_ffffffffffffffd8);
  pQVar1 = QEventPoint::device((QEventPoint *)in_stack_ffffffffffffffe0);
  if (pQVar1 == (QPointingDevice *)0x0) {
    QPointerEvent::pointingDevice(in_RDI);
    QMutableEventPoint::setDevice((QEventPoint *)p,(QPointingDevice *)in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = p;
  }
  other = QEventPoint::state((QEventPoint *)in_stack_ffffffffffffffe0);
  QFlags<QEventPoint::State>::operator|=
            ((QFlags<QEventPoint::State> *)&in_RDI[1].super_QInputEvent.field_0x8,other);
  return;
}

Assistant:

void QMutableTouchEvent::addPoint(QTouchEvent *e, const QEventPoint &point)
{
    e->m_points.append(point);
    auto &added = e->m_points.last();
    if (!added.device())
        QMutableEventPoint::setDevice(added, e->pointingDevice());
    e->m_touchPointStates |= point.state();
}